

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  uint32_t uVar13;
  BaseType BVar14;
  SPIRType *pSVar15;
  undefined8 *puVar16;
  long *plVar17;
  SPIRVariable *pSVar18;
  SPIRType *pSVar19;
  runtime_error *this_00;
  ulong *puVar20;
  size_type *psVar21;
  uint uVar22;
  uint uVar23;
  char *pcVar24;
  ulong uVar25;
  undefined8 uVar26;
  char (*ts_2) [2];
  uint32_t __val;
  SPIRType *pSVar27;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar28;
  string decl_type;
  ID local_3c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  uint32_t local_39c;
  char *overlapping_binding_tag;
  long local_390;
  ulong local_388;
  long lStack_380;
  SPIRType *local_378;
  string array_type;
  string pack_pfx;
  string __str_1;
  string __str;
  string base_type;
  uint *local_2b0;
  uint local_298 [8];
  bool *local_278;
  size_t local_270;
  bool local_260 [24];
  TypedID<(spirv_cross::Types)1> *local_248;
  size_t local_240;
  TypedID<(spirv_cross::Types)1> local_230 [8];
  uint *local_210;
  size_t local_208;
  uint local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  undefined1 local_180 [192];
  SmallVector<unsigned_int,_8UL> local_c0;
  ImageType local_88;
  TypeID TStack_70;
  TypeID TStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined1 local_40 [16];
  
  bVar10 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  uVar13 = member_type_id;
  if (bVar10) {
    uVar13 = Compiler::get_extended_member_decoration
                       ((Compiler *)this,(type->super_IVariant).self.id,index,
                        SPIRVCrossDecorationPhysicalTypeID);
  }
  pSVar15 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar13);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar10 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationInterfaceOrigID);
  local_3c4.id = 0;
  if (bVar10) {
    local_3c4.id = Compiler::get_extended_member_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,index,
                              SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar10 = Compiler::is_matrix((Compiler *)this,pSVar15);
  bVar11 = false;
  if (bVar10) {
    bVar11 = Compiler::has_member_decoration
                       ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                        DecorationRowMajor);
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._0_8_ = &PTR__SPIRType_003a2fa8;
  local_180._8_4_ = 0;
  local_180._12_4_ = 0x18;
  local_180._16_4_ = Unknown;
  local_180._20_4_ = 0;
  local_180._24_4_ = 1;
  local_180._28_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_8_ = (ulong)(ushort)local_180._126_2_ << 0x30;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_68._0_8_ = local_40 + 8;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  TStack_6c.id = 0;
  local_88.sampled = 0;
  local_88.format = ImageFormatUnknown;
  local_88.access = AccessQualifierReadOnly;
  TStack_70.id = 0;
  local_68._8_8_ = 1;
  local_58 = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  bVar10 = Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset
                     );
  if ((bVar10) ||
     (bVar10 = Compiler::has_extended_member_decoration
                         ((Compiler *)this,(type->super_IVariant).self.id,index,
                          SPIRVCrossDecorationResourceIndexPrimary), bVar10)) {
    this->is_using_builtin_array = true;
  }
  bVar10 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar27 = pSVar15;
  local_39c = index;
  local_378 = type;
  if (bVar10) {
    if (pSVar15->basetype == Struct) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot emit a packed struct currently.");
      goto LAB_001e2fb0;
    }
    bVar10 = Compiler::is_matrix((Compiler *)this,pSVar15);
    if (!bVar10) {
      bVar10 = Compiler::is_scalar((Compiler *)this,pSVar15);
      if (!bVar10) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x30da16);
      }
      goto LAB_001e298f;
    }
    uVar13 = pSVar15->vecsize;
    __val = pSVar15->columns;
    ::std::__cxx11::string::_M_replace
              ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x30da16);
    if (bVar11 != false) {
      __val = pSVar15->vecsize;
      uVar13 = pSVar15->columns;
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x300fb3);
    }
    bVar10 = pSVar15->width == 0x10;
    pcVar24 = "float";
    if (bVar10) {
      pcVar24 = "half";
    }
    base_type._M_dataplus._M_p = (pointer)&base_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&base_type,pcVar24,pcVar24 + ((ulong)bVar10 ^ 5));
    array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&array_type,"typedef ","");
    ::std::operator+(&local_3c0,"packed_",&base_type);
    cVar12 = '\x01';
    if (9 < uVar13) {
      uVar25 = (ulong)uVar13;
      cVar9 = '\x04';
      do {
        cVar12 = cVar9;
        uVar22 = (uint)uVar25;
        if (uVar22 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001e2377;
        }
        if (uVar22 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001e2377;
        }
        if (uVar22 < 10000) goto LAB_001e2377;
        uVar25 = uVar25 / 10000;
        cVar9 = cVar12 + '\x04';
      } while (99999 < uVar22);
      cVar12 = cVar12 + '\x01';
    }
LAB_001e2377:
    overlapping_binding_tag = (char *)&local_388;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar12);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_390,uVar13);
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      uVar26 = local_3c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < local_390 + local_3c0._M_string_length) {
      uVar25 = 0xf;
      if ((ulong *)overlapping_binding_tag != &local_388) {
        uVar25 = local_388;
      }
      if (uVar25 < local_390 + local_3c0._M_string_length) goto LAB_001e23e2;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&overlapping_binding_tag,0,(char *)0x0,
                           (ulong)local_3c0._M_dataplus._M_p);
    }
    else {
LAB_001e23e2:
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)overlapping_binding_tag)
      ;
    }
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar21 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar21) {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type.field_2._8_8_ = puVar16[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type._M_dataplus._M_p = (pointer)*puVar16;
    }
    decl_type._M_string_length = puVar16[1];
    *puVar16 = psVar21;
    puVar16[1] = 0;
    *(char *)psVar21 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    paVar1 = &decl_type.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != paVar1) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((ulong *)overlapping_binding_tag != &local_388) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    ::std::operator+(&decl_type," ",&pack_pfx);
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != paVar1) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    uVar22 = pSVar15->columns;
    cVar12 = '\x01';
    if (9 < uVar22) {
      uVar23 = uVar22;
      cVar9 = '\x04';
      do {
        cVar12 = cVar9;
        if (uVar23 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001e2514;
        }
        if (uVar23 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001e2514;
        }
        if (uVar23 < 10000) goto LAB_001e2514;
        bVar10 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar9 = cVar12 + '\x04';
      } while (bVar10);
      cVar12 = cVar12 + '\x01';
    }
LAB_001e2514:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,cVar12);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar22);
    plVar17 = (long *)::std::__cxx11::string::replace
                                ((ulong)&__str,0,(char *)0x0,(ulong)base_type._M_dataplus._M_p);
    overlapping_binding_tag = (char *)&local_388;
    puVar20 = (ulong *)(plVar17 + 2);
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    if ((ulong *)*plVar17 == puVar20) {
      local_388 = *puVar20;
      lStack_380 = plVar17[3];
    }
    else {
      local_388 = *puVar20;
      overlapping_binding_tag = (char *)*plVar17;
    }
    local_390 = plVar17[1];
    *plVar17 = (long)puVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)::std::__cxx11::string::append((char *)&overlapping_binding_tag);
    puVar20 = (ulong *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_3c0.field_2._M_allocated_capacity = *puVar20;
      local_3c0.field_2._8_8_ = plVar17[3];
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *puVar20;
      local_3c0._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_3c0._M_string_length = plVar17[1];
    *plVar17 = (long)puVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    uVar22 = pSVar15->vecsize;
    cVar12 = '\x01';
    if (9 < uVar22) {
      uVar23 = uVar22;
      cVar9 = '\x04';
      do {
        cVar12 = cVar9;
        if (uVar23 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001e2659;
        }
        if (uVar23 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001e2659;
        }
        if (uVar23 < 10000) goto LAB_001e2659;
        bVar10 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar9 = cVar12 + '\x04';
      } while (bVar10);
      cVar12 = cVar12 + '\x01';
    }
LAB_001e2659:
    paVar2 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar12);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar22);
    uVar25 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             local_3c0._M_string_length;
    uVar26 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      uVar26 = local_3c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar26 < uVar25) {
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar2) {
        uVar26 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < uVar25) goto LAB_001e26de;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&__str_1,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
    }
    else {
LAB_001e26de:
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_3c0,(ulong)__str_1._M_dataplus._M_p);
    }
    psVar21 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar21) {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type.field_2._8_8_ = puVar16[3];
      decl_type._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type._M_dataplus._M_p = (pointer)*puVar16;
    }
    decl_type._M_string_length = puVar16[1];
    *puVar16 = psVar21;
    puVar16[1] = 0;
    *(char *)psVar21 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != paVar1) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar2) {
      operator_delete(__str_1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if ((ulong *)overlapping_binding_tag != &local_388) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    index = local_39c;
    cVar12 = '\x01';
    if (9 < __val) {
      uVar25 = (ulong)__val;
      cVar9 = '\x04';
      do {
        cVar12 = cVar9;
        uVar22 = (uint)uVar25;
        if (uVar22 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001e2809;
        }
        if (uVar22 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001e2809;
        }
        if (uVar22 < 10000) goto LAB_001e2809;
        uVar25 = uVar25 / 10000;
        cVar9 = cVar12 + '\x04';
      } while (99999 < uVar22);
      cVar12 = cVar12 + '\x01';
    }
LAB_001e2809:
    overlapping_binding_tag = (char *)&local_388;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar12);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(overlapping_binding_tag,(uint)local_390,__val)
    ;
    plVar17 = (long *)::std::__cxx11::string::replace
                                ((ulong)&overlapping_binding_tag,0,(char *)0x0,0x2e4336);
    puVar20 = (ulong *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_3c0.field_2._M_allocated_capacity = *puVar20;
      local_3c0.field_2._8_8_ = plVar17[3];
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *puVar20;
      local_3c0._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_3c0._M_string_length = plVar17[1];
    *plVar17 = (long)puVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)::std::__cxx11::string::append((char *)&local_3c0);
    psVar21 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar21) {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type.field_2._8_8_ = plVar17[3];
      decl_type._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type._M_dataplus._M_p = (pointer)*plVar17;
    }
    decl_type._M_string_length = plVar17[1];
    *plVar17 = (long)psVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != paVar1) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if ((ulong *)overlapping_binding_tag != &local_388) {
      operator_delete(overlapping_binding_tag);
    }
    ::std::__cxx11::string::append((char *)&array_type);
    pVar28 = ::std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->typedef_lines,&array_type);
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Compiler::force_recompile((Compiler *)this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)array_type._M_dataplus._M_p != &array_type.field_2) {
      operator_delete(array_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    bVar10 = Compiler::is_matrix((Compiler *)this,pSVar15);
    if (bVar10) {
      if (((this->msl_options).msl_version < 30000) &&
         (bVar10 = Compiler::has_extended_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,
                              SPIRVCrossDecorationWorkgroupStruct), bVar10)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x300fc7);
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        this->is_using_builtin_array = true;
      }
      if (bVar11 != false) {
        local_180._8_4_ = (pSVar15->super_IVariant).self.id;
        local_180._28_4_ = pSVar15->columns;
        uVar26 = *(undefined8 *)&(pSVar15->super_IVariant).field_0xc;
        uVar3 = pSVar15->width;
        uVar4 = pSVar15->vecsize;
        local_180._12_4_ = (undefined4)uVar26;
        local_180._16_4_ = (undefined4)((ulong)uVar26 >> 0x20);
        local_180._20_4_ = uVar3;
        local_180._24_4_ = uVar4;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(local_180 + 0x20),&pSVar15->array);
        SmallVector<bool,_8UL>::operator=
                  ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&pSVar15->array_size_literal);
        local_180._120_4_ = pSVar15->pointer_depth;
        local_180[0x7c] = pSVar15->pointer;
        local_180[0x7d] = pSVar15->forward_pointer;
        local_180._126_2_ = *(undefined2 *)&pSVar15->field_0x7e;
        local_180._128_4_ = pSVar15->storage;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   (local_180 + 0x88),&pSVar15->member_types);
        SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar15->member_type_index_redirection)
        ;
        index = local_39c;
        uVar26._0_4_ = (pSVar15->image).type;
        uVar26._4_4_ = (pSVar15->image).dim;
        uVar5._0_1_ = (pSVar15->image).depth;
        uVar5._1_1_ = (pSVar15->image).arrayed;
        uVar5._2_1_ = (pSVar15->image).ms;
        uVar5._3_1_ = (pSVar15->image).field_0xb;
        uVar5._4_4_ = (pSVar15->image).sampled;
        uVar6 = pSVar15->type_alias;
        uVar7 = pSVar15->parent_type;
        local_88._0_7_ = SUB87(uVar26,0);
        local_88.dim._3_1_ = (undefined1)((uint)uVar26._4_4_ >> 0x18);
        local_88._8_3_ = SUB83(uVar5,0);
        local_88._11_1_ = uVar5._3_1_;
        local_88.sampled = uVar5._4_4_;
        local_88.format = (pSVar15->image).format;
        local_88.access = (pSVar15->image).access;
        TStack_70.id = uVar6;
        TStack_6c.id = uVar7;
        if (pSVar15 != (SPIRType *)local_180) {
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_68,&(pSVar15->member_name_cache)._M_h);
        }
        uVar8 = local_180._24_4_;
        local_180._24_4_ = local_180._28_4_;
        local_180._28_4_ = uVar8;
        pSVar27 = (SPIRType *)local_180;
      }
    }
  }
LAB_001e298f:
  BVar14 = pSVar15->basetype;
  if ((BVar14 == Image) && ((pSVar15->image).sampled == 2)) {
    if (((this->msl_options).platform != iOS) ||
       (0 < (int)(this->msl_options).argument_buffers_tier)) {
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      array_type._M_string_length = 0;
      array_type.field_2._M_local_buf[0] = '\0';
      goto LAB_001e2b04;
    }
    bVar10 = Compiler::has_decoration((Compiler *)this,local_3c4,DecorationNonWritable);
    if (!bVar10) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"Writable images are not allowed on Tier1 argument buffers on iOS.");
LAB_001e2fb0:
      *(undefined ***)this_00 = &PTR__runtime_error_003a2f80;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    BVar14 = pSVar15->basetype;
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  if (BVar14 - Image < 3) goto LAB_001e2b04;
  decl_type._M_dataplus._M_p._0_4_ = 0x7fffffff;
  uVar25 = (ulong)(this->stage_out_var_id).id;
  if (uVar25 == 0) {
LAB_001e2a41:
    uVar25 = (ulong)(this->stage_in_var_id).id;
    if (uVar25 != 0) {
      pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar25);
      pSVar19 = Compiler::get_variable_data_type((Compiler *)this,pSVar18);
      if (((pSVar19->super_IVariant).self.id == (local_378->super_IVariant).self.id) &&
         (bVar10 = variable_storage_requires_stage_io(this,StorageClassInput), bVar10))
      goto LAB_001e2a87;
    }
  }
  else {
    pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar25);
    pSVar19 = Compiler::get_variable_data_type((Compiler *)this,pSVar18);
    if (((pSVar19->super_IVariant).self.id != (local_378->super_IVariant).self.id) ||
       ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_001e2a41;
LAB_001e2a87:
    bVar10 = Compiler::is_member_builtin((Compiler *)this,local_378,index,(BuiltIn *)&decl_type);
    if (bVar10) {
      this->is_using_builtin_array = true;
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&base_type,this,pSVar15,(ulong)local_3c4.id);
  ::std::__cxx11::string::operator=((string *)&array_type,(string *)&base_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_type._M_dataplus._M_p != &base_type.field_2) {
    operator_delete(base_type._M_dataplus._M_p);
  }
LAB_001e2b04:
  if (local_3c4.id != 0) {
    bVar10 = Compiler::is_pointer((Compiler *)this,pSVar27);
    pSVar15 = pSVar27;
    if (bVar10) {
      pSVar15 = Compiler::get_pointee_type((Compiler *)this,pSVar27);
    }
    bVar10 = Compiler::is_array((Compiler *)this,pSVar15);
    if ((bVar10) && (uVar13 = get_resource_array_size(this,pSVar15,local_3c4.id), uVar13 == 0)) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&array_type,0,(char *)array_type._M_string_length,0x301015);
    }
  }
  decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
  decl_type._M_string_length = 0;
  decl_type.field_2._M_allocated_capacity =
       decl_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pSVar27->vecsize < 5) {
    type_to_glsl_abi_cxx11_(&base_type,this,pSVar27,local_3c4.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&base_type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
    SPIRType::SPIRType((SPIRType *)&base_type,pSVar15);
    bVar10 = Compiler::is_matrix((Compiler *)this,(SPIRType *)&base_type);
    if ((bVar11 & bVar10) == 1) {
      base_type.field_2._8_4_ = base_type.field_2._12_4_;
    }
    base_type.field_2._12_4_ = 1;
    ts_2 = (char (*) [2])&DAT_00000001;
    type_to_glsl_abi_cxx11_(&local_3c0,this,(SPIRType *)&base_type,local_3c4.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    if (pSVar27->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (&local_3c0,(spirv_cross *)"spvPaddedStd140<",(char (*) [17])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x301ae0,ts_2)
      ;
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3c0);
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_3c0,(spirv_cross *)"spvPaddedStd140Matrix<",(char (*) [23])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300ad6,
                 (char (*) [3])&pSVar27->columns,(uint *)0x301ae0,
                 (char (*) [2])decl_type._M_dataplus._M_p);
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p);
    }
    base_type._M_dataplus._M_p = "l#\x18";
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1b8);
    local_208 = 0;
    if (local_210 != local_1f8) {
      free(local_210);
    }
    local_240 = 0;
    if (local_248 != local_230) {
      free(local_248);
    }
    local_270 = 0;
    if (local_278 != local_260) {
      free(local_278);
    }
    if (local_2b0 != local_298) {
      free(local_2b0);
    }
  }
  pSVar15 = local_378;
  uVar13 = local_39c;
  bVar10 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(local_378->super_IVariant).self.id,local_39c,
                      SPIRVCrossDecorationOverlappingBinding);
  overlapping_binding_tag = "";
  if (bVar10) {
    overlapping_binding_tag = "// Overlapping binding: ";
  }
  CompilerGLSL::to_member_name_abi_cxx11_(&base_type,&this->super_CompilerGLSL,pSVar15,uVar13);
  member_attribute_qualifier_abi_cxx11_(&local_3c0,this,pSVar15,uVar13);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&overlapping_binding_tag,(char **)&pack_pfx,
             &decl_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f14f1,
             (char (*) [2])qualifier,&base_type,&local_3c0,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30eb86,
             (char (*) [2])decl_type._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_type._M_dataplus._M_p != &base_type.field_2) {
    operator_delete(base_type._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
    operator_delete(decl_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != &array_type.field_2) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  local_180._0_8_ = &PTR__SPIRType_003a2fa8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}